

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.cpp
# Opt level: O1

void __thiscall CEffects::HammerHit(CEffects *this,vec2 Pos)

{
  int iVar1;
  long in_FS_OFFSET;
  float fVar2;
  CParticle local_68;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.m_Vel.field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)0x0;
  local_68.m_Vel.field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0;
  local_68.m_Rot = 0.0;
  local_68.m_Rotspeed = 0.0;
  local_68.m_Gravity = 0.0;
  local_68.m_Friction = 0.0;
  local_68.m_Color.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
  local_68.m_Color.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
  local_68.m_Color.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
  local_68.m_Color.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f800000;
  local_68.m_Spr = 9;
  local_68.m_FlowAffected = 1.0;
  local_68.m_LifeSpan = 0.3;
  local_68.m_StartSize = 120.0;
  local_68.m_EndSize = 0.0;
  local_68.m_Pos = Pos;
  iVar1 = rand();
  fVar2 = (float)iVar1 * 4.656613e-10 * 3.1415927;
  local_68.m_Rot = fVar2 + fVar2;
  CParticles::Add(((this->super_CComponent).m_pClient)->m_pParticles,1,&local_68);
  CSounds::PlayAt(((this->super_CComponent).m_pClient)->m_pSounds,2,4,1.0,Pos);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEffects::HammerHit(vec2 Pos)
{
	// add the explosion
	CParticle p;
	p.SetDefault();
	p.m_Spr = SPRITE_PART_HIT01;
	p.m_Pos = Pos;
	p.m_LifeSpan = 0.3f;
	p.m_StartSize = 120.0f;
	p.m_EndSize = 0;
	p.m_Rot = random_float()*pi*2;
	m_pClient->m_pParticles->Add(CParticles::GROUP_EXPLOSIONS, &p);
	m_pClient->m_pSounds->PlayAt(CSounds::CHN_WORLD, SOUND_HAMMER_HIT, 1.0f, Pos);
}